

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_face.c
# Opt level: O3

REF_STATUS ref_face_inspect(REF_FACE ref_face)

{
  REF_INT *pRVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  REF_INT sort [4];
  REF_INT orig [4];
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  REF_INT local_48 [6];
  
  printf("ref_face = %p\n",ref_face);
  printf(" n = %d\n",(ulong)(uint)ref_face->n);
  printf(" max = %d\n",(ulong)(uint)ref_face->max);
  if (0 < ref_face->n) {
    lVar4 = 0xc;
    uVar5 = 0;
    do {
      pRVar1 = ref_face->f2n;
      printf("face %4d : %4d %4d %4d %4d\n",uVar5 & 0xffffffff,
             (ulong)*(uint *)((long)pRVar1 + lVar4 + -0xc),
             (ulong)*(uint *)((long)pRVar1 + lVar4 + -8),(ulong)*(uint *)((long)pRVar1 + lVar4 + -4)
             ,(ulong)*(uint *)((long)pRVar1 + lVar4));
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x10;
    } while ((long)uVar5 < (long)ref_face->n);
    if (0 < ref_face->n) {
      lVar4 = 0;
      uVar5 = 0;
      do {
        pRVar1 = ref_face->f2n;
        lVar3 = 0;
        do {
          local_48[lVar3] = *(REF_INT *)((long)pRVar1 + lVar3 * 4 + lVar4);
          lVar3 = lVar3 + 1;
        } while (lVar3 != 4);
        uVar2 = ref_sort_insertion_int(4,local_48,(REF_INT *)&local_58);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_face.c",
                 0x62,"ref_face_inspect",(ulong)uVar2,"sort");
          return uVar2;
        }
        printf("sort %4d : %4d %4d %4d %4d\n",uVar5 & 0xffffffff,(ulong)local_58,(ulong)local_54,
               (ulong)local_50,(ulong)local_4c);
        uVar5 = uVar5 + 1;
        lVar4 = lVar4 + 0x10;
      } while ((long)uVar5 < (long)ref_face->n);
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_face_inspect(REF_FACE ref_face) {
  REF_INT face, node, orig[4], sort[4];

  printf("ref_face = %p\n", (void *)ref_face);
  printf(" n = %d\n", ref_face_n(ref_face));
  printf(" max = %d\n", ref_face_max(ref_face));
  for (face = 0; face < ref_face_n(ref_face); face++)
    printf("face %4d : %4d %4d %4d %4d\n", face,
           ref_face_f2n(ref_face, 0, face), ref_face_f2n(ref_face, 1, face),
           ref_face_f2n(ref_face, 2, face), ref_face_f2n(ref_face, 3, face));
  for (face = 0; face < ref_face_n(ref_face); face++) {
    for (node = 0; node < 4; node++)
      orig[node] = ref_face_f2n(ref_face, node, face);
    RSS(ref_sort_insertion_int(4, orig, sort), "sort");
    printf("sort %4d : %4d %4d %4d %4d\n", face, sort[0], sort[1], sort[2],
           sort[3]);
  }
  return REF_SUCCESS;
}